

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigAndLookup(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int nFans1;
  int nFans0;
  uint Key;
  Abc_Obj_t *pConst1;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *p1_local;
  Abc_Obj_t *p0_local;
  Abc_Aig_t *pMan_local;
  
  pAVar4 = Abc_ObjRegular(p0);
  if ((Abc_Aig_t *)pAVar4->pNtk->pManFunc != pMan) {
    __assert_fail("Abc_ObjRegular(p0)->pNtk->pManFunc == pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                  ,0x197,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar4 = Abc_ObjRegular(p1);
  if ((Abc_Aig_t *)pAVar4->pNtk->pManFunc == pMan) {
    pAVar4 = Abc_AigConst1(pMan->pNtkAig);
    pMan_local = (Abc_Aig_t *)p0;
    if (p0 != p1) {
      pAVar5 = Abc_ObjNot(p1);
      if (p0 == pAVar5) {
        pMan_local = (Abc_Aig_t *)Abc_ObjNot(pAVar4);
      }
      else {
        pAVar5 = Abc_ObjRegular(p0);
        if (pAVar5 == pAVar4) {
          pMan_local = (Abc_Aig_t *)p1;
          if (p0 != pAVar4) {
            pMan_local = (Abc_Aig_t *)Abc_ObjNot(pAVar4);
          }
        }
        else {
          pAVar5 = Abc_ObjRegular(p1);
          if (pAVar5 == pAVar4) {
            if (p1 != pAVar4) {
              pMan_local = (Abc_Aig_t *)Abc_ObjNot(pAVar4);
            }
          }
          else {
            pAVar4 = Abc_ObjRegular(p0);
            iVar1 = Abc_ObjFanoutNum(pAVar4);
            pAVar4 = Abc_ObjRegular(p1);
            iVar2 = Abc_ObjFanoutNum(pAVar4);
            if ((iVar1 == 0) || (iVar2 == 0)) {
              pMan_local = (Abc_Aig_t *)0x0;
            }
            else {
              pAVar4 = Abc_ObjRegular(p0);
              iVar1 = pAVar4->Id;
              pAVar4 = Abc_ObjRegular(p1);
              pAnd = p1;
              p1_local = p0;
              if (pAVar4->Id < iVar1) {
                pAnd = p0;
                p1_local = p1;
              }
              uVar3 = Abc_HashKey2(p1_local,pAnd,pMan->nBins);
              for (pConst1 = pMan->pBins[uVar3]; pConst1 != (Abc_Obj_t *)0x0;
                  pConst1 = pConst1->pNext) {
                pAVar4 = Abc_ObjChild0(pConst1);
                if ((p1_local == pAVar4) && (pAVar4 = Abc_ObjChild1(pConst1), pAnd == pAVar4)) {
                  return pConst1;
                }
              }
              pMan_local = (Abc_Aig_t *)0x0;
            }
          }
        }
      }
    }
    return (Abc_Obj_t *)pMan_local;
  }
  __assert_fail("Abc_ObjRegular(p1)->pNtk->pManFunc == pMan",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                ,0x198,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_AigAndLookup( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1 )
{
    Abc_Obj_t * pAnd, * pConst1;
    unsigned Key;
    assert( Abc_ObjRegular(p0)->pNtk->pManFunc == pMan );
    assert( Abc_ObjRegular(p1)->pNtk->pManFunc == pMan );
    // check for trivial cases
    pConst1 = Abc_AigConst1(pMan->pNtkAig);
    if ( p0 == p1 )
        return p0;
    if ( p0 == Abc_ObjNot(p1) )
        return Abc_ObjNot(pConst1);
    if ( Abc_ObjRegular(p0) == pConst1 )
    {
        if ( p0 == pConst1 )
            return p1;
        return Abc_ObjNot(pConst1);
    }
    if ( Abc_ObjRegular(p1) == pConst1 )
    {
        if ( p1 == pConst1 )
            return p0;
        return Abc_ObjNot(pConst1);
    }
/*
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            pMan->nStrash0++;
        else if ( nFans0 == 1 || nFans1 == 1 )
            pMan->nStrash1++;
        else if ( nFans0 <= 100 && nFans1 <= 100 )
            pMan->nStrash5++;
        else
            pMan->nStrash2++;
    }
*/
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            return NULL;
    }

    // order the arguments
    if ( Abc_ObjRegular(p0)->Id > Abc_ObjRegular(p1)->Id )
        pAnd = p0, p0 = p1, p1 = pAnd;
    // get the hash key for these two nodes
    Key = Abc_HashKey2( p0, p1, pMan->nBins );
    // find the matching node in the table
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
        if ( p0 == Abc_ObjChild0(pAnd) && p1 == Abc_ObjChild1(pAnd) )
        {
//            assert( Abc_ObjFanoutNum(Abc_ObjRegular(p0)) && Abc_ObjFanoutNum(p1) );
             return pAnd;
        }
    return NULL;
}